

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_astring.c
# Opt level: O0

void test_AString_insertAString_failure_bufferExpansionFailed_fn(int _i)

{
  AString string;
  AString string_00;
  bool bVar1;
  int iVar2;
  char *in_stack_fffffffffffffea0;
  uintmax_t _ck_y_6;
  uintmax_t _ck_x_8;
  uintmax_t _ck_y_5;
  uintmax_t _ck_x_7;
  char *_ck_y_q_1;
  char *_ck_x_q_1;
  char *_ck_y_s_1;
  char *_ck_x_s_1;
  char *_ck_y_4;
  char *_ck_x_6;
  void *_ck_x_5;
  uintmax_t _ck_y_3;
  uintmax_t _ck_x_4;
  uintmax_t _ck_y_2;
  uintmax_t _ck_x_3;
  char *_ck_y_q;
  char *_ck_x_q;
  char *_ck_y_s;
  char *_ck_x_s;
  char *_ck_y_1;
  char *_ck_x_2;
  void *_ck_x_1;
  uintmax_t _ck_y;
  uintmax_t _ck_x;
  AString srcString;
  AString destString;
  int _i_local;
  
  private_ACUtilsTest_AString_constructTestString((AString *)&srcString.buffer,"01678",8);
  private_ACUtilsTest_AString_constructTestString((AString *)&_ck_x,"2345",8);
  private_ACUtilsTest_AString_setReallocFail(true,0);
  bVar1 = AString_insertAString((AString *)&srcString.buffer,2,(AString *)&_ck_x);
  if (bVar1 != false) {
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x381,
                      "Assertion \'!AString_insertAString(&destString, 2, &srcString)\' failed",0);
  }
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x381);
  if (destString.size != 8) {
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x382,"Assertion \'_ck_x == _ck_y\' failed",
                      "Assertion \'%s\' failed: %s == %ju, %s == %ju","(destString).capacity == (8)"
                      ,"(destString).capacity",destString.size,"(8)",8,0);
  }
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x382);
  if (destString.capacity == 0) {
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x382,"Assertion \'_ck_x != NULL\' failed",
                      "Assertion \'%s\' failed: %s == %#x","(void*) (destString).buffer != NULL",
                      "(void*) (destString).buffer",0,0);
  }
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x382);
  if (destString.capacity == 0) {
    _ck_y_q = "";
    _ck_y_s = "(null)";
  }
  else {
    _ck_y_q = "\"";
    iVar2 = strcmp("01678",(char *)destString.capacity);
    _ck_y_s = (char *)destString.capacity;
    if (iVar2 == 0) {
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x382);
      if (destString.deallocator != (ACUtilsDeallocator)0x5) {
        _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,0x382,"Assertion \'_ck_x == _ck_y\' failed",
                          "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                          "(destString).size == strlen(\"01678\")","(destString).size",
                          destString.deallocator,"strlen(\"01678\")",5,0);
      }
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x382);
      if (srcString.size != 8) {
        _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,899,"Assertion \'_ck_x == _ck_y\' failed",
                          "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                          "(srcString).capacity == (8)","(srcString).capacity",srcString.size,"(8)",
                          8,0);
      }
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,899);
      if (srcString.capacity == 0) {
        _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,899,"Assertion \'_ck_x != NULL\' failed",
                          "Assertion \'%s\' failed: %s == %#x","(void*) (srcString).buffer != NULL",
                          "(void*) (srcString).buffer",0,0);
      }
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,899);
      _ck_y_s_1 = (char *)srcString.capacity;
      if (srcString.capacity == 0) {
        _ck_y_q_1 = "";
        _ck_y_s_1 = "(null)";
      }
      else {
        _ck_y_q_1 = "\"";
        iVar2 = strcmp("2345",(char *)srcString.capacity);
        if (iVar2 == 0) {
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,899);
          if (srcString.deallocator != (ACUtilsDeallocator)0x4) {
            _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                              ,899,"Assertion \'_ck_x == _ck_y\' failed",
                              "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                              "(srcString).size == strlen(\"2345\")","(srcString).size",
                              srcString.deallocator,"strlen(\"2345\")",4,0);
          }
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,899);
          if (private_ACUtilsTest_AString_reallocCount == 0) {
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,900);
            string.deallocator = (ACUtilsDeallocator)0x5;
            string.reallocator = destString.reallocator;
            string.size = 8;
            string.capacity = destString.capacity;
            string.buffer = in_stack_fffffffffffffea0;
            private_ACUtilsTest_AString_destructTestString(string);
            string_00.deallocator = srcString.deallocator;
            string_00.reallocator = srcString.reallocator;
            string_00.size = srcString.size;
            string_00.capacity = srcString.capacity;
            string_00.buffer = in_stack_fffffffffffffea0;
            private_ACUtilsTest_AString_destructTestString(string_00);
            return;
          }
          _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                            ,900,"Assertion \'_ck_x == _ck_y\' failed",
                            "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                            "private_ACUtilsTest_AString_reallocCount == (0)",
                            "private_ACUtilsTest_AString_reallocCount",
                            private_ACUtilsTest_AString_reallocCount,"(0)",0,0);
        }
      }
      _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,899,
                        "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
                        ,"Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s",
                        "(srcString).buffer == (\"2345\")","(srcString).buffer",_ck_y_q_1,_ck_y_s_1,
                        _ck_y_q_1,"(\"2345\")","\"","2345","\"",0);
    }
  }
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,0x382,
                    "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
                    ,"Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s",
                    "(destString).buffer == (\"01678\")","(destString).buffer",_ck_y_q,_ck_y_s,
                    _ck_y_q,"(\"01678\")","\"","01678","\"",0);
}

Assistant:

END_TEST
START_TEST(test_AString_insertAString_failure_bufferExpansionFailed)
{
    struct AString destString = private_ACUtilsTest_AString_constructTestString("01678", 8);
    struct AString srcString = private_ACUtilsTest_AString_constructTestString("2345", 8);
    private_ACUtilsTest_AString_setReallocFail(true, 0);
    ACUTILSTEST_ASSERT(!AString_insertAString(&destString, 2, &srcString));
    ACUTILSTEST_ASTRING_CHECK_ASTRING(destString, "01678", 8);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(srcString, "2345", 8);
    ACUTILSTEST_ASTRING_CHECK_REALLOC(0);
    private_ACUtilsTest_AString_destructTestString(destString);
    private_ACUtilsTest_AString_destructTestString(srcString);
}